

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> __thiscall
draco::PointCloud::CreateAttribute
          (PointCloud *this,GeometryAttribute *att,bool identity_mapping,
          ValueType num_attribute_values)

{
  Type TVar1;
  uint *puVar2;
  byte in_CL;
  GeometryAttribute *in_RDX;
  PointAttribute *in_RSI;
  _Head_base<0UL,_draco::PointAttribute_*,_false> in_RDI;
  uint in_R8D;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa;
  pointer in_stack_ffffffffffffff98;
  PointAttribute *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  uint local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_20 = in_R8D;
  TVar1 = GeometryAttribute::attribute_type(in_RDX);
  if (TVar1 == INVALID) {
    std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>::
    unique_ptr<std::default_delete<draco::PointAttribute>,void>
              ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    uVar3 = 0;
    operator_new(0x70);
    PointAttribute::PointAttribute(in_RSI,&(in_RDI._M_head_impl)->super_GeometryAttribute);
    std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>::
    unique_ptr<std::default_delete<draco::PointAttribute>,void>
              ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((local_19 & 1) == 0) {
      std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
      operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
                 0x19c0ff);
      PointAttribute::SetExplicitMapping
                (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    }
    else {
      std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
      operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
                 0x19c161);
      PointAttribute::SetIdentityMapping((PointAttribute *)0x19c169);
      puVar2 = std::max<unsigned_int>
                         ((uint *)&in_RSI[1].super_GeometryAttribute.byte_offset_,&local_20);
      local_20 = *puVar2;
    }
    if (local_20 != 0) {
      std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
      operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
                 0x19c1a4);
      PointAttribute::Reset
                ((PointAttribute *)CONCAT17(uVar3,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd0);
    }
  }
  return (__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
          )(tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<PointAttribute> PointCloud::CreateAttribute(
    const GeometryAttribute &att, bool identity_mapping,
    AttributeValueIndex::ValueType num_attribute_values) const {
  if (att.attribute_type() == GeometryAttribute::INVALID) {
    return nullptr;
  }
  std::unique_ptr<PointAttribute> pa =
      std::unique_ptr<PointAttribute>(new PointAttribute(att));
  // Initialize point cloud specific attribute data.
  if (!identity_mapping) {
    // First create mapping between indices.
    pa->SetExplicitMapping(num_points_);
  } else {
    pa->SetIdentityMapping();
    num_attribute_values = std::max(num_points_, num_attribute_values);
  }
  if (num_attribute_values > 0) {
    pa->Reset(num_attribute_values);
  }
  return pa;
}